

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestString.cpp
# Opt level: O0

void __thiscall UnitTest_string1::Run(UnitTest_string1 *this)

{
  bool bVar1;
  __type _Var2;
  byte bVar3;
  undefined1 uVar4;
  size_t sVar5;
  size_t sVar6;
  String str2;
  String str1;
  String *in_stack_fffffffffffffb08;
  allocator *paVar7;
  undefined7 in_stack_fffffffffffffb10;
  undefined1 in_stack_fffffffffffffb17;
  char *in_stack_fffffffffffffb18;
  String *in_stack_fffffffffffffb20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb28;
  String *in_stack_fffffffffffffb30;
  undefined7 in_stack_fffffffffffffb38;
  undefined1 in_stack_fffffffffffffb3f;
  undefined7 in_stack_fffffffffffffb48;
  undefined1 in_stack_fffffffffffffb4f;
  UnitTestBase *in_stack_fffffffffffffb50;
  undefined7 in_stack_fffffffffffffb68;
  undefined1 in_stack_fffffffffffffb6f;
  allocator local_3c1;
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [39];
  allocator local_359;
  string local_358 [39];
  allocator local_331;
  string local_330 [39];
  allocator local_309;
  string local_308 [39];
  undefined1 local_2e1 [40];
  allocator local_2b9;
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [39];
  allocator local_251;
  string local_250 [39];
  allocator local_229;
  string local_228 [39];
  allocator local_201;
  string local_200 [39];
  allocator local_1d9;
  string local_1d8 [39];
  allocator local_1b1;
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [39];
  allocator local_149;
  string local_148 [39];
  allocator local_121;
  string local_120 [39];
  allocator local_f9;
  string local_f8 [39];
  allocator local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [48];
  String local_78;
  String local_40;
  
  luna::String::String(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  luna::String::String(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  bVar1 = luna::operator==((String *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10),
                           in_stack_fffffffffffffb08);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"\'str1 == str2\'",&local_a9);
    UnitTestBase::Error(in_stack_fffffffffffffb50,
                        (string *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  }
  bVar1 = luna::operator<=((String *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10),
                           in_stack_fffffffffffffb08);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"\'str1 <= str2\'",&local_d1);
    UnitTestBase::Error(in_stack_fffffffffffffb50,
                        (string *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  }
  bVar1 = luna::operator>=((String *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10),
                           in_stack_fffffffffffffb08);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f8,"\'str1 >= str2\'",&local_f9);
    UnitTestBase::Error(in_stack_fffffffffffffb50,
                        (string *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
    std::__cxx11::string::~string(local_f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  }
  sVar5 = luna::String::GetHash(&local_40);
  sVar6 = luna::String::GetHash(&local_78);
  if (sVar5 != sVar6) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_120,"\'str1.GetHash() == str2.GetHash()\'",&local_121);
    UnitTestBase::Error(in_stack_fffffffffffffb50,
                        (string *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
    std::__cxx11::string::~string(local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
  }
  sVar5 = luna::String::GetLength(&local_40);
  sVar6 = luna::String::GetLength(&local_78);
  if (sVar5 != sVar6) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_148,"\'str1.GetLength() == str2.GetLength()\'",&local_149);
    UnitTestBase::Error(in_stack_fffffffffffffb50,
                        (string *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
    std::__cxx11::string::~string(local_148);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
  }
  luna::String::GetStdString_abi_cxx11_
            ((String *)CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68));
  luna::String::GetStdString_abi_cxx11_
            ((String *)CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68));
  _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  std::__cxx11::string::~string(local_190);
  std::__cxx11::string::~string(local_170);
  if (((_Var2 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_1b0,"\'str1.GetStdString() == str2.GetStdString()\'",&local_1b1);
    UnitTestBase::Error(in_stack_fffffffffffffb50,
                        (string *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
    std::__cxx11::string::~string(local_1b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  }
  luna::String::SetValue(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  luna::String::SetValue(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  bVar1 = luna::operator!=((String *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10),
                           in_stack_fffffffffffffb08);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d8,"\'str1 != str2\'",&local_1d9);
    UnitTestBase::Error(in_stack_fffffffffffffb50,
                        (string *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
    std::__cxx11::string::~string(local_1d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  }
  bVar1 = luna::operator<((String *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                          in_stack_fffffffffffffb30);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_200,"\'str1 < str2\'",&local_201);
    UnitTestBase::Error(in_stack_fffffffffffffb50,
                        (string *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
    std::__cxx11::string::~string(local_200);
    std::allocator<char>::~allocator((allocator<char> *)&local_201);
  }
  bVar1 = luna::operator>((String *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10),
                          in_stack_fffffffffffffb08);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_228,"\'str2 > str1\'",&local_229);
    UnitTestBase::Error(in_stack_fffffffffffffb50,
                        (string *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
    std::__cxx11::string::~string(local_228);
    std::allocator<char>::~allocator((allocator<char> *)&local_229);
  }
  sVar5 = luna::String::GetLength(&local_40);
  sVar6 = luna::String::GetLength(&local_78);
  if (sVar6 <= sVar5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_250,"\'str1.GetLength() < str2.GetLength()\'",&local_251);
    UnitTestBase::Error(in_stack_fffffffffffffb50,
                        (string *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
    std::__cxx11::string::~string(local_250);
    std::allocator<char>::~allocator((allocator<char> *)&local_251);
  }
  luna::String::GetStdString_abi_cxx11_
            ((String *)CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68));
  luna::String::GetStdString_abi_cxx11_
            ((String *)CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68));
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffb08);
  bVar3 = bVar1 ^ 0xff;
  std::__cxx11::string::~string(local_298);
  std::__cxx11::string::~string(local_278);
  if ((bVar3 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_2b8,"\'str1.GetStdString() != str2.GetStdString()\'",&local_2b9);
    UnitTestBase::Error(in_stack_fffffffffffffb50,
                        (string *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
    std::__cxx11::string::~string(local_2b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  }
  luna::String::SetValue(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  luna::String::SetValue(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  bVar1 = luna::operator!=((String *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10),
                           in_stack_fffffffffffffb08);
  if (!bVar1) {
    in_stack_fffffffffffffb50 = (UnitTestBase *)local_2e1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_2e1 + 1),"\'str1 != str2\'",(allocator *)in_stack_fffffffffffffb50);
    UnitTestBase::Error(in_stack_fffffffffffffb50,
                        (string *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
    std::__cxx11::string::~string((string *)(local_2e1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_2e1);
  }
  uVar4 = luna::operator<((String *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                          in_stack_fffffffffffffb30);
  if (!(bool)uVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_308,"\'str1 < str2\'",&local_309);
    UnitTestBase::Error(in_stack_fffffffffffffb50,
                        (string *)CONCAT17(uVar4,in_stack_fffffffffffffb48));
    std::__cxx11::string::~string(local_308);
    std::allocator<char>::~allocator((allocator<char> *)&local_309);
  }
  bVar1 = luna::operator>((String *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10),
                          in_stack_fffffffffffffb08);
  if (!bVar1) {
    paVar7 = &local_331;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_330,"\'str2 > str1\'",paVar7);
    UnitTestBase::Error(in_stack_fffffffffffffb50,
                        (string *)CONCAT17(uVar4,in_stack_fffffffffffffb48));
    std::__cxx11::string::~string(local_330);
    std::allocator<char>::~allocator((allocator<char> *)&local_331);
  }
  sVar5 = luna::String::GetLength(&local_40);
  sVar6 = luna::String::GetLength(&local_78);
  if (sVar5 != sVar6) {
    paVar7 = &local_359;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_358,"\'str1.GetLength() == str2.GetLength()\'",paVar7);
    UnitTestBase::Error(in_stack_fffffffffffffb50,
                        (string *)CONCAT17(uVar4,in_stack_fffffffffffffb48));
    std::__cxx11::string::~string(local_358);
    std::allocator<char>::~allocator((allocator<char> *)&local_359);
  }
  luna::String::GetStdString_abi_cxx11_((String *)CONCAT17(bVar3,in_stack_fffffffffffffb68));
  luna::String::GetStdString_abi_cxx11_((String *)CONCAT17(bVar3,in_stack_fffffffffffffb68));
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffb08);
  bVar3 = bVar1 ^ 0xff;
  std::__cxx11::string::~string(local_3a0);
  std::__cxx11::string::~string(local_380);
  if ((bVar3 & 1) != 0) {
    paVar7 = &local_3c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3c0,"\'str1.GetStdString() != str2.GetStdString()\'",paVar7);
    UnitTestBase::Error(in_stack_fffffffffffffb50,
                        (string *)CONCAT17(uVar4,in_stack_fffffffffffffb48));
    std::__cxx11::string::~string(local_3c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  }
  luna::String::~String((String *)CONCAT17(bVar3,in_stack_fffffffffffffb10));
  luna::String::~String((String *)CONCAT17(bVar3,in_stack_fffffffffffffb10));
  return;
}

Assistant:

TEST_CASE(string1)
{
    luna::String str1("abc");
    luna::String str2("abc");

    EXPECT_TRUE(str1 == str2);
    EXPECT_TRUE(str1 <= str2);
    EXPECT_TRUE(str1 >= str2);
    EXPECT_TRUE(str1.GetHash() == str2.GetHash());
    EXPECT_TRUE(str1.GetLength() == str2.GetLength());
    EXPECT_TRUE(str1.GetStdString() == str2.GetStdString());

    str1.SetValue("abcdefghijklmn");
    str2.SetValue("abcdefghijklmnopqrst");
    EXPECT_TRUE(str1 != str2);
    EXPECT_TRUE(str1 < str2);
    EXPECT_TRUE(str2 > str1);
    EXPECT_TRUE(str1.GetLength() < str2.GetLength());
    EXPECT_TRUE(str1.GetStdString() != str2.GetStdString());

    str1.SetValue("abc");
    str2.SetValue("def");
    EXPECT_TRUE(str1 != str2);
    EXPECT_TRUE(str1 < str2);
    EXPECT_TRUE(str2 > str1);
    EXPECT_TRUE(str1.GetLength() == str2.GetLength());
    EXPECT_TRUE(str1.GetStdString() != str2.GetStdString());
}